

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

Entry * __thiscall
wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeExactRefs_Test::TestBody()::__0>
          (Entry *this,HeapType type,anon_class_8_1_911e227b map)

{
  anon_class_16_2_633b9489 *paVar1;
  Type TVar2;
  uintptr_t *puVar3;
  uintptr_t uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  Type TVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uintptr_t *puVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Signature SVar16;
  Array AVar17;
  undefined1 local_b0 [8];
  anon_class_16_2_633b9489 copySingleType;
  undefined1 local_98 [8];
  anon_class_16_2_ecc023e0 copyType;
  Field field;
  undefined1 auStack_68 [8];
  vector<wasm::Field,_std::allocator<wasm::Field>_> fields;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> local_38;
  
  paVar1 = (anon_class_16_2_633b9489 *)this->builder;
  TVar2.id = this->index;
  local_38._M_head_impl = (Impl *)map.builder;
  if (type.id < 0x7d) {
    __assert_fail("!type.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x2df,
                  "void wasm::TypeBuilder::copyHeapType(size_t, HeapType, F) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)]"
                 );
  }
  auVar14 = ::wasm::HeapType::getDeclaredSuperType();
  if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    bVar13 = false;
    auVar15 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
    uVar6 = auVar15._8_8_;
    if (auVar15._0_8_ != auVar14._0_8_) {
      uVar11 = 0xffffffffffffffff;
      do {
        if (uVar11 == 2) {
          bVar13 = true;
          goto LAB_001e2f29;
        }
        auVar15 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
        uVar6 = auVar15._8_8_;
        uVar11 = uVar11 + 1;
      } while (auVar15._0_8_ != auVar14._0_8_);
      bVar13 = 2 < uVar11;
    }
    uVar6 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
LAB_001e2f29:
    if (bVar13) goto LAB_001e32c8;
    ::wasm::TypeBuilder::setSubType(paVar1,TVar2.id,uVar6,1);
  }
  auVar14 = ::wasm::HeapType::getDescriptorType();
  if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    bVar13 = false;
    auVar15 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
    uVar6 = auVar15._8_8_;
    if (auVar15._0_8_ != auVar14._0_8_) {
      uVar11 = 0xffffffffffffffff;
      do {
        if (uVar11 == 2) {
          bVar13 = true;
          goto LAB_001e2fb2;
        }
        auVar15 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
        uVar6 = auVar15._8_8_;
        uVar11 = uVar11 + 1;
      } while (auVar15._0_8_ != auVar14._0_8_);
      bVar13 = 2 < uVar11;
    }
    uVar6 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
LAB_001e2fb2:
    if (bVar13) goto LAB_001e32c8;
    ::wasm::TypeBuilder::setDescriptor(paVar1,TVar2.id,uVar6,1);
  }
  auVar14 = ::wasm::HeapType::getDescribedType();
  if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    bVar13 = false;
    auVar15 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
    uVar6 = auVar15._8_8_;
    if (auVar15._0_8_ != auVar14._0_8_) {
      uVar11 = 0xffffffffffffffff;
      do {
        if (uVar11 == 2) {
          bVar13 = true;
          goto LAB_001e303b;
        }
        auVar15 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
        uVar6 = auVar15._8_8_;
        uVar11 = uVar11 + 1;
      } while (auVar15._0_8_ != auVar14._0_8_);
      bVar13 = 2 < uVar11;
    }
    uVar6 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
LAB_001e303b:
    if (bVar13) goto LAB_001e32c8;
    ::wasm::TypeBuilder::setDescribed(paVar1,TVar2.id,uVar6,1);
  }
  ::wasm::HeapType::isOpen();
  ::wasm::TypeBuilder::setOpen((ulong)paVar1,SUB81(TVar2.id,0));
  ::wasm::HeapType::getShared();
  ::wasm::TypeBuilder::setShared((ulong)paVar1,(Shareability)TVar2.id);
  local_98 = (undefined1  [8])local_b0;
  copySingleType.this = (TypeBuilder *)&local_38;
  local_b0 = (undefined1  [8])paVar1;
  copyType.copySingleType = paVar1;
  uVar5 = ::wasm::HeapType::getKind();
  switch(uVar5) {
  case 0:
    ::wasm::handle_unreachable
              ("unexpected kind",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
               ,0x31b);
  case 1:
    auVar14 = ::wasm::HeapType::getSignature();
    TVar7 = copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
            ::anon_class_16_2_ecc023e0::operator()
                      ((anon_class_16_2_ecc023e0 *)local_98,auVar14._0_8_);
    copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
    ::anon_class_16_2_ecc023e0::operator()((anon_class_16_2_ecc023e0 *)local_98,(Type)auVar14._8_8_)
    ;
    SVar16.results.id = TVar7.id;
    SVar16.params.id = TVar2.id;
    ::wasm::TypeBuilder::setHeapType((ulong)paVar1,SVar16);
    break;
  case 2:
    copySingleType.map = (anon_class_8_1_911e227b *)this;
    plVar8 = (long *)::wasm::HeapType::getStruct();
    auStack_68 = (undefined1  [8])0x0;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_68,
               plVar8[1] - *plVar8 >> 4);
    puVar12 = (uintptr_t *)*plVar8;
    puVar3 = (uintptr_t *)plVar8[1];
    if (puVar12 != puVar3) {
      do {
        copyType.this = (TypeBuilder *)*puVar12;
        uVar4 = puVar12[1];
        copyType.this =
             (TypeBuilder *)
             copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
             ::anon_class_16_2_ecc023e0::operator()
                       ((anon_class_16_2_ecc023e0 *)local_98,(Type)copyType.this);
        if (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_start ==
            fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Field,std::allocator<wasm::Field>>::
          _M_realloc_insert<wasm::Field_const&>
                    ((vector<wasm::Field,std::allocator<wasm::Field>> *)auStack_68,
                     (iterator)
                     fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                     super__Vector_impl_data._M_start,(Field *)&copyType.this);
        }
        else {
          ((fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_start)->type).id = (uintptr_t)copyType.this;
          (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start)->packedType = (int)uVar4;
          (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start)->mutable_ = (int)(uVar4 >> 0x20);
          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_start =
               fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        puVar12 = puVar12 + 2;
      } while (puVar12 != puVar3);
    }
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&copyType.this,
               (vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_68);
    ::wasm::TypeBuilder::setHeapType((ulong)paVar1,(Struct *)TVar2.id);
    this = (Entry *)copySingleType.map;
    if (copyType.this != (TypeBuilder *)0x0) {
      operator_delete(copyType.this,field._8_8_ - (long)copyType.this);
    }
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
    }
    break;
  case 3:
    ::wasm::HeapType::getArray();
    auStack_68 = (undefined1  [8])
                 copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
                 ::anon_class_16_2_ecc023e0::operator()
                           ((anon_class_16_2_ecc023e0 *)local_98,(Type)auStack_68);
    AVar17.element._8_8_ = auStack_68;
    AVar17.element.type.id = TVar2.id;
    ::wasm::TypeBuilder::setHeapType((ulong)paVar1,AVar17);
    break;
  case 4:
    lVar9 = ::wasm::HeapType::getContinuation();
    bVar13 = false;
    lVar10 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
    if (lVar10 != lVar9) {
      uVar11 = 0xffffffffffffffff;
      do {
        if (uVar11 == 2) {
          bVar13 = true;
          goto LAB_001e32a2;
        }
        lVar10 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
        uVar11 = uVar11 + 1;
      } while (lVar10 != lVar9);
      bVar13 = 2 < uVar11;
    }
    ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
LAB_001e32a2:
    if (bVar13) {
LAB_001e32c8:
      ::wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1c3);
    }
    ::wasm::TypeBuilder::setHeapType((ulong)paVar1,(Continuation)TVar2.id);
  }
  return this;
}

Assistant:

Entry& copy(HeapType type, F map) {
      builder.copyHeapType(index, type, map);
      return *this;
    }